

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O1

bool IsZXSpectrumDevice(char *name)

{
  int iVar1;
  
  if (name == (char *)0x0) {
    return false;
  }
  iVar1 = strcmp(name,"ZXSPECTRUM48");
  if (((((iVar1 != 0) && (iVar1 = strcmp(name,"ZXSPECTRUM128"), iVar1 != 0)) &&
       (iVar1 = strcmp(name,"ZXSPECTRUM256"), iVar1 != 0)) &&
      ((iVar1 = strcmp(name,"ZXSPECTRUM512"), iVar1 != 0 &&
       (iVar1 = strcmp(name,"ZXSPECTRUM1024"), iVar1 != 0)))) &&
     ((iVar1 = strcmp(name,"ZXSPECTRUM2048"), iVar1 != 0 &&
      ((iVar1 = strcmp(name,"ZXSPECTRUM4096"), iVar1 != 0 &&
       (iVar1 = strcmp(name,"ZXSPECTRUM8192"), iVar1 != 0)))))) {
    return false;
  }
  return true;
}

Assistant:

bool IsZXSpectrumDevice(const char *name) {
	if (nullptr == name) return false;
	if (strcmp(name, "ZXSPECTRUM48") &&
		strcmp(name, "ZXSPECTRUM128") &&
		strcmp(name, "ZXSPECTRUM256") &&
		strcmp(name, "ZXSPECTRUM512") &&
		strcmp(name, "ZXSPECTRUM1024") &&
		strcmp(name, "ZXSPECTRUM2048") &&
		strcmp(name, "ZXSPECTRUM4096") &&
		strcmp(name, "ZXSPECTRUM8192"))
	{
		return false;
	}
	return true;
}